

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

TCGv_ptr get_fpstatus_ptr_aarch64(TCGContext_conflict1 *tcg_ctx,_Bool is_f16)

{
  TCGv_ptr ret;
  undefined7 in_register_00000031;
  
  ret = tcg_temp_new_ptr(tcg_ctx);
  tcg_gen_addi_i64_aarch64
            (tcg_ctx,(TCGv_i64)ret,(TCGv_i64)tcg_ctx->cpu_env,
             (CONCAT71(in_register_00000031,is_f16) & 0xffffffff) * 8 + 0x2ec8);
  return ret;
}

Assistant:

TCGv_ptr get_fpstatus_ptr(TCGContext *tcg_ctx, bool is_f16)
{
    TCGv_ptr statusptr = tcg_temp_new_ptr(tcg_ctx);
    int offset;

    /* In A64 all instructions (both FP and Neon) use the FPCR; there
     * is no equivalent of the A32 Neon "standard FPSCR value".
     * However half-precision operations operate under a different
     * FZ16 flag and use vfp.fp_status_f16 instead of vfp.fp_status.
     */
    if (is_f16) {
        offset = offsetof(CPUARMState, vfp.fp_status_f16);
    } else {
        offset = offsetof(CPUARMState, vfp.fp_status);
    }
    tcg_gen_addi_ptr(tcg_ctx, statusptr, tcg_ctx->cpu_env, offset);
    return statusptr;
}